

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O3

bool __thiscall cmComputeTargetDepends::Compute(cmComputeTargetDepends *this)

{
  bool bVar1;
  cmComputeComponentGraph ccg;
  string local_118;
  undefined1 local_f8 [16];
  Graph local_e8 [8];
  
  CollectTargets(this);
  CollectDepends(this);
  if (this->DebugMode == true) {
    local_f8._0_8_ = (Graph *)(local_f8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"initial","");
    DisplayGraph(this,&this->InitialGraph,(string *)local_f8);
    if ((Graph *)local_f8._0_8_ != (Graph *)(local_f8 + 0x10)) {
      operator_delete((void *)local_f8._0_8_,
                      (ulong)((long)local_e8[0].
                                    super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                                    super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 1));
    }
  }
  cmComputeComponentGraph::cmComputeComponentGraph
            ((cmComputeComponentGraph *)local_f8,&this->InitialGraph);
  if (this->DebugMode == true) {
    DisplayComponents(this,(cmComputeComponentGraph *)local_f8);
  }
  bVar1 = CheckComponents(this,(cmComputeComponentGraph *)local_f8);
  if (bVar1) {
    bVar1 = ComputeFinalDepends(this,(cmComputeComponentGraph *)local_f8);
    if (bVar1) {
      bVar1 = true;
      if (this->DebugMode == true) {
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"final","");
        DisplayGraph(this,&this->FinalGraph,&local_118);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
        }
      }
      goto LAB_0035d6aa;
    }
  }
  bVar1 = false;
LAB_0035d6aa:
  cmComputeComponentGraph::~cmComputeComponentGraph((cmComputeComponentGraph *)local_f8);
  return bVar1;
}

Assistant:

bool cmComputeTargetDepends::Compute()
{
  // Build the original graph.
  this->CollectTargets();
  this->CollectDepends();
  if(this->DebugMode)
    {
    this->DisplayGraph(this->InitialGraph, "initial");
    }

  // Identify components.
  cmComputeComponentGraph ccg(this->InitialGraph);
  if(this->DebugMode)
    {
    this->DisplayComponents(ccg);
    }
  if(!this->CheckComponents(ccg))
    {
    return false;
    }

  // Compute the final dependency graph.
  if(!this->ComputeFinalDepends(ccg))
    {
    return false;
    }
  if(this->DebugMode)
    {
    this->DisplayGraph(this->FinalGraph, "final");
    }

  return true;
}